

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O3

VkCommandBuffer __thiscall
VulkanUtilities::VulkanLogicalDevice::AllocateVkCommandBuffer
          (VulkanLogicalDevice *this,VkCommandBufferAllocateInfo *AllocInfo,char *DebugName)

{
  VkResult VVar1;
  char (*in_RCX) [66];
  char *in_R8;
  VkCommandBuffer CmdBuff;
  string msg;
  undefined1 local_51;
  char *local_50;
  VkCommandBuffer local_48;
  string local_40;
  
  local_50 = DebugName;
  if (AllocInfo->sType != VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO) {
    Diligent::FormatString<char[26],char[66]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"AllocInfo.sType == VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO",
               in_RCX);
    Diligent::DebugAssertionFailed
              (local_40._M_dataplus._M_p,"AllocateVkCommandBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,399);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (DebugName == (char *)0x0) {
    DebugName = "";
    local_50 = "";
  }
  local_48 = (VkCommandBuffer)0x0;
  VVar1 = (*vkAllocateCommandBuffers)(this->m_VkDevice,AllocInfo,&local_48);
  if (VVar1 != VK_SUCCESS) {
    local_51 = 0x27;
    Diligent::FormatString<char[36],char_const*,char>
              (&local_40,(Diligent *)"Failed to allocate command buffer \'",(char (*) [36])&local_50
               ,(char **)&local_51,in_R8);
    Diligent::DebugAssertionFailed
              (local_40._M_dataplus._M_p,"AllocateVkCommandBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x197);
    DebugName = local_50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      DebugName = local_50;
    }
  }
  if (*DebugName != '\0') {
    SetCommandBufferName(this->m_VkDevice,local_48,DebugName);
  }
  return local_48;
}

Assistant:

VkCommandBuffer VulkanLogicalDevice::AllocateVkCommandBuffer(const VkCommandBufferAllocateInfo& AllocInfo, const char* DebugName) const
{
    VERIFY_EXPR(AllocInfo.sType == VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO);

    if (DebugName == nullptr)
        DebugName = "";

    VkCommandBuffer CmdBuff = VK_NULL_HANDLE;

    VkResult err = vkAllocateCommandBuffers(m_VkDevice, &AllocInfo, &CmdBuff);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to allocate command buffer '", DebugName, '\'');
    (void)err;

    if (*DebugName != 0)
        SetCommandBufferName(m_VkDevice, CmdBuff, DebugName);

    return CmdBuff;
}